

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLinLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  int iVar6;
  ImU32 IVar7;
  uint uVar8;
  GetterXsYRef<unsigned_short> *pGVar9;
  GetterXsYRef<unsigned_short> *pGVar10;
  ImDrawVert *pIVar11;
  ImDrawIdx *pIVar12;
  double dVar13;
  ImDrawIdx IVar14;
  bool bVar15;
  float fVar16;
  double dVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  pGVar9 = this->Getter1;
  pGVar10 = this->Getter2;
  iVar5 = pGVar9->Count;
  iVar6 = this->Transformer->YAxis;
  dVar17 = (double)GImPlot->PixelRange[iVar6].Min.x;
  dVar2 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  fVar22 = (float)(((double)*(ushort *)
                             ((long)pGVar9->Xs +
                             (long)(((pGVar9->Offset + prim) % iVar5 + iVar5) % iVar5) *
                             (long)pGVar9->Stride) - dVar2) * GImPlot->Mx + dVar17);
  dVar13 = (double)GImPlot->PixelRange[iVar6].Min.y;
  dVar3 = GImPlot->CurrentPlot->YAxis[iVar6].Range.Min;
  fVar23 = (float)((pGVar9->YRef - dVar3) * GImPlot->My[iVar6] + dVar13);
  iVar5 = pGVar10->Count;
  fVar19 = (float)(((double)*(ushort *)
                             ((long)pGVar10->Xs +
                             (long)(((prim + pGVar10->Offset) % iVar5 + iVar5) % iVar5) *
                             (long)pGVar10->Stride) - dVar2) * GImPlot->Mx + dVar17);
  fVar18 = (float)((pGVar10->YRef - dVar3) * GImPlot->My[iVar6] + dVar13);
  fVar21 = fVar23;
  if (fVar18 <= fVar23) {
    fVar21 = fVar18;
  }
  bVar15 = false;
  if ((fVar21 < (cull_rect->Max).y) &&
     (fVar21 = (float)(~-(uint)(fVar18 <= fVar23) & (uint)fVar18 |
                      -(uint)(fVar18 <= fVar23) & (uint)fVar23), pfVar1 = &(cull_rect->Min).y,
     bVar15 = false, *pfVar1 <= fVar21 && fVar21 != *pfVar1)) {
    fVar21 = fVar22;
    if (fVar19 <= fVar22) {
      fVar21 = fVar19;
    }
    if (fVar21 < (cull_rect->Max).x) {
      fVar21 = (float)(~-(uint)(fVar19 <= fVar22) & (uint)fVar19 |
                      -(uint)(fVar19 <= fVar22) & (uint)fVar22);
      bVar15 = (cull_rect->Min).x <= fVar21 && fVar21 != (cull_rect->Min).x;
    }
  }
  if (bVar15 != false) {
    fVar21 = this->Weight;
    IVar7 = this->Col;
    IVar4 = *uv;
    fVar20 = fVar19 - fVar22;
    fVar24 = fVar18 - fVar23;
    fVar16 = fVar20 * fVar20 + fVar24 * fVar24;
    if (0.0 < fVar16) {
      if (fVar16 < 0.0) {
        fVar16 = sqrtf(fVar16);
      }
      else {
        fVar16 = SQRT(fVar16);
      }
      fVar20 = fVar20 * (1.0 / fVar16);
      fVar24 = fVar24 * (1.0 / fVar16);
    }
    fVar21 = fVar21 * 0.5;
    fVar20 = fVar20 * fVar21;
    fVar21 = fVar21 * fVar24;
    pIVar11 = DrawList->_VtxWritePtr;
    (pIVar11->pos).x = fVar21 + fVar22;
    (pIVar11->pos).y = fVar23 - fVar20;
    pIVar11->uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar7;
    pIVar11[1].pos.x = fVar21 + fVar19;
    pIVar11[1].pos.y = fVar18 - fVar20;
    pIVar11[1].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar7;
    pIVar11[2].pos.x = fVar19 - fVar21;
    pIVar11[2].pos.y = fVar20 + fVar18;
    pIVar11[2].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar7;
    pIVar11[3].pos.x = fVar22 - fVar21;
    pIVar11[3].pos.y = fVar20 + fVar23;
    pIVar11[3].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar8 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar14 = (ImDrawIdx)uVar8;
    *pIVar12 = IVar14;
    pIVar12[1] = IVar14 + 1;
    pIVar12[2] = IVar14 + 2;
    pIVar12[3] = IVar14;
    pIVar12[4] = IVar14 + 2;
    pIVar12[5] = IVar14 + 3;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar8 + 4;
  }
  return bVar15;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }